

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O1

void __thiscall
t_c_glib_generator::generate_service_handler(t_c_glib_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  long lVar6;
  t_function *ptVar7;
  t_type *ptVar8;
  t_struct *ptVar9;
  t_struct *ptVar10;
  int iVar11;
  long *plVar12;
  undefined4 extraout_var;
  undefined8 *puVar13;
  ostream *poVar14;
  long *plVar15;
  size_type *psVar16;
  ulong *puVar17;
  size_type *psVar18;
  pointer pptVar19;
  pointer pptVar20;
  undefined8 uVar21;
  ulong uVar22;
  string parent_service_name_uc;
  string parent_service_name_lc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string class_name_lc;
  string class_name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string service_name_uc;
  string parent_service_name;
  string args_indent;
  string service_name_lc;
  string parent_class_name;
  string service_handler_name;
  string parent_type_name;
  string class_name_uc;
  char local_634;
  string local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  string local_5e8;
  string local_5c8;
  ulong *local_5a8;
  long local_5a0;
  ulong local_598;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  ulong *local_588;
  long local_580;
  ulong local_578;
  long lStack_570;
  long *local_568;
  long local_560;
  long local_558;
  long lStack_550;
  ulong *local_548;
  long local_540;
  ulong local_538;
  long lStack_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  vector<t_function_*,_std::allocator<t_function_*>_> local_508;
  string local_4f0;
  pointer local_4d0;
  pointer local_4c8;
  pointer local_4c0;
  string local_4b8;
  long *local_498;
  long local_490;
  long local_488;
  long lStack_480;
  t_function local_478;
  ulong *local_3d8;
  long local_3d0;
  ulong local_3c8;
  long lStack_3c0;
  ulong *local_3b8;
  long local_3b0;
  ulong local_3a8;
  long lStack_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  char *local_390;
  long local_388;
  char local_380 [16];
  string local_370;
  char *local_350;
  long local_348;
  char local_340 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  char *local_2b0;
  char *local_2a8;
  char local_2a0 [16];
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_508,&tservice->functions_)
  ;
  pcVar5 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar5,
             pcVar5 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  initial_caps_to_underscores(&local_50,&local_90);
  to_lower_case(&local_370,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_370._M_dataplus._M_p,
             local_370._M_dataplus._M_p + local_370._M_string_length);
  to_upper_case(&local_4f0,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  pcVar5 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_330,pcVar5,
             pcVar5 + (this->super_t_oop_generator).super_t_generator.service_name_._M_string_length
            );
  std::__cxx11::string::append((char *)&local_330);
  local_398 = &this->nspace;
  std::operator+(&local_528,local_398,&local_330);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_330._M_dataplus._M_p,
             local_330._M_dataplus._M_p + local_330._M_string_length);
  initial_caps_to_underscores((string *)&local_478,&local_d0);
  plVar12 = (long *)std::__cxx11::string::replace
                              ((ulong)&local_478,0,(char *)0x0,
                               (ulong)(this->nspace_lc)._M_dataplus._M_p);
  local_568 = &local_558;
  plVar15 = plVar12 + 2;
  if ((long *)*plVar12 == plVar15) {
    local_558 = *plVar15;
    lStack_550 = plVar12[3];
  }
  else {
    local_558 = *plVar15;
    local_568 = (long *)*plVar12;
  }
  local_560 = plVar12[1];
  *plVar12 = (long)plVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  psVar18 = &local_478.super_t_doc.doc_._M_string_length;
  if (local_478.super_t_doc._vptr_t_doc != (_func_int **)psVar18) {
    operator_delete(local_478.super_t_doc._vptr_t_doc);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,local_568,(long)local_568 + local_560);
  to_upper_case(&local_290,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_350 = local_340;
  local_348 = 0;
  local_340[0] = '\0';
  local_2b0 = local_2a0;
  local_2a8 = (char *)0x0;
  local_2a0[0] = '\0';
  local_390 = local_380;
  local_388 = 0;
  local_380[0] = '\0';
  if (tservice->extends_ == (t_service *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_350,0,(char *)0x0,0x37a2c2);
    std::__cxx11::string::_M_replace((ulong)&local_2b0,0,local_2a8,0x37a2ca);
  }
  else {
    iVar11 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
    lVar6 = *(long *)CONCAT44(extraout_var,iVar11);
    local_478.super_t_doc._vptr_t_doc = (_func_int **)psVar18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_478,lVar6,((long *)CONCAT44(extraout_var,iVar11))[1] + lVar6);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,local_478.super_t_doc._vptr_t_doc,
               local_478.super_t_doc.doc_._M_dataplus._M_p + (long)local_478.super_t_doc._vptr_t_doc
              );
    initial_caps_to_underscores(&local_70,&local_110);
    to_lower_case(&local_5c8,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_5c8._M_dataplus._M_p,
               local_5c8._M_dataplus._M_p + local_5c8._M_string_length);
    to_upper_case(&local_5e8,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    std::operator+(&local_608,local_398,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_478);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_608);
    paVar3 = &local_628.field_2;
    psVar16 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_628.field_2._M_allocated_capacity = *psVar16;
      local_628.field_2._8_8_ = plVar12[3];
      local_628._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_628.field_2._M_allocated_capacity = *psVar16;
      local_628._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_628._M_string_length = plVar12[1];
    *plVar12 = (long)psVar16;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_350,(string *)&local_628);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != paVar3) {
      operator_delete(local_628._M_dataplus._M_p);
    }
    paVar4 = &local_608.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != paVar4) {
      operator_delete(local_608._M_dataplus._M_p);
    }
    pcVar5 = (this->nspace_uc)._M_dataplus._M_p;
    local_5a8 = &local_598;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a8,pcVar5,pcVar5 + (this->nspace_uc)._M_string_length);
    std::__cxx11::string::append((char *)&local_5a8);
    puVar13 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_5a8,(ulong)local_5e8._M_dataplus._M_p);
    puVar17 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_608.field_2._M_allocated_capacity = *puVar17;
      local_608.field_2._8_8_ = puVar13[3];
      local_608._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_608.field_2._M_allocated_capacity = *puVar17;
      local_608._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_608._M_string_length = puVar13[1];
    *puVar13 = puVar17;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_608);
    puVar17 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_628.field_2._M_allocated_capacity = *puVar17;
      local_628.field_2._8_8_ = puVar13[3];
      local_628._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_628.field_2._M_allocated_capacity = *puVar17;
      local_628._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_628._M_string_length = puVar13[1];
    *puVar13 = puVar17;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2b0,(string *)&local_628);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != paVar3) {
      operator_delete(local_628._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != paVar4) {
      operator_delete(local_608._M_dataplus._M_p);
    }
    if (local_5a8 != &local_598) {
      operator_delete(local_5a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
      operator_delete(local_5e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
      operator_delete(local_5c8._M_dataplus._M_p);
    }
    if (local_478.super_t_doc._vptr_t_doc != (_func_int **)psVar18) {
      operator_delete(local_478.super_t_doc._vptr_t_doc);
    }
  }
  poVar1 = &this->f_header_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* ",3);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,
                       (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus.
                       _M_p,(this->super_t_oop_generator).super_t_generator.service_name_.
                            _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14," handler (abstract base class) */",0x21);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"struct _",8);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_528._M_dataplus._M_p,local_528._M_string_length);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_478,(t_generator *)this);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(char *)local_478.super_t_doc._vptr_t_doc,
                       (long)local_478.super_t_doc.doc_._M_dataplus._M_p);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_350,local_348);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," parent;",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_478.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_478.super_t_doc.doc_._M_string_length) {
    operator_delete(local_478.super_t_doc._vptr_t_doc);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"};",2);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"typedef struct _",0x10);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,";",1);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"struct _",8);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Class",5);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_((string *)&local_478,(t_generator *)this);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(char *)local_478.super_t_doc._vptr_t_doc,
                       (long)local_478.super_t_doc.doc_._M_dataplus._M_p);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_350,local_348);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Class parent;",0xd);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_478.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_478.super_t_doc.doc_._M_string_length) {
    operator_delete(local_478.super_t_doc._vptr_t_doc);
  }
  pptVar19 = local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar5 = ((*pptVar19)->name_)._M_dataplus._M_p;
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,pcVar5,pcVar5 + ((*pptVar19)->name_)._M_string_length);
      initial_caps_to_underscores((string *)&local_478,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      ptVar7 = *pptVar19;
      ptVar8 = ptVar7->returntype_;
      ptVar9 = ptVar7->arglist_;
      ptVar10 = ptVar7->xceptions_;
      iVar11 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])(ptVar8);
      local_4c0 = (ptVar9->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_4c8 = (ptVar9->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      local_4d0 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar20 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      std::operator+(&local_2d0,"(",local_398);
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_2d0,
                                   (ulong)(this->super_t_oop_generator).super_t_generator.
                                          service_name_._M_dataplus._M_p);
      local_498 = &local_488;
      plVar15 = plVar12 + 2;
      if ((long *)*plVar12 == plVar15) {
        local_488 = *plVar15;
        lStack_480 = plVar12[3];
      }
      else {
        local_488 = *plVar15;
        local_498 = (long *)*plVar12;
      }
      local_490 = plVar12[1];
      *plVar12 = (long)plVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_498);
      local_5a8 = &local_598;
      puVar17 = (ulong *)(plVar12 + 2);
      if ((ulong *)*plVar12 == puVar17) {
        local_598 = *puVar17;
        uStack_590 = (undefined4)plVar12[3];
        uStack_58c = *(undefined4 *)((long)plVar12 + 0x1c);
      }
      else {
        local_598 = *puVar17;
        local_5a8 = (ulong *)*plVar12;
      }
      local_5a0 = plVar12[1];
      *plVar12 = (long)puVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_634 = (char)iVar11;
      if (local_634 == '\0') {
        type_name_abi_cxx11_(&local_150,this,ptVar8,false,false);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,0x3a9b9f);
        local_2f0 = &local_2e0;
        plVar15 = plVar12 + 2;
        if ((long *)*plVar12 == plVar15) {
          local_2e0 = *plVar15;
          lStack_2d8 = plVar12[3];
        }
        else {
          local_2e0 = *plVar15;
          local_2f0 = (long *)*plVar12;
        }
        local_2e8 = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_588 = &local_578;
        puVar17 = (ulong *)(plVar12 + 2);
        if ((ulong *)*plVar12 == puVar17) {
          local_578 = *puVar17;
          lStack_570 = plVar12[3];
        }
        else {
          local_578 = *puVar17;
          local_588 = (ulong *)*plVar12;
        }
        local_580 = plVar12[1];
        *plVar12 = (long)puVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
      }
      else {
        local_588 = &local_578;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"");
      }
      uVar22 = 0xf;
      if (local_5a8 != &local_598) {
        uVar22 = local_598;
      }
      if (uVar22 < (ulong)(local_580 + local_5a0)) {
        uVar22 = 0xf;
        if (local_588 != &local_578) {
          uVar22 = local_578;
        }
        if (uVar22 < (ulong)(local_580 + local_5a0)) goto LAB_0015b98c;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_588,0,(char *)0x0,(ulong)local_5a8);
      }
      else {
LAB_0015b98c:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5a8,(ulong)local_588)
        ;
      }
      local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
      puVar17 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_608.field_2._M_allocated_capacity = *puVar17;
        local_608.field_2._8_8_ = puVar13[3];
      }
      else {
        local_608.field_2._M_allocated_capacity = *puVar17;
        local_608._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_608._M_string_length = puVar13[1];
      *puVar13 = puVar17;
      puVar13[1] = 0;
      *(undefined1 *)puVar17 = 0;
      if (local_4c8 == local_4c0) {
        local_548 = &local_538;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_548,"");
      }
      else {
        argument_list_abi_cxx11_(&local_170,this,ptVar9);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,0x3a9b9f);
        local_548 = &local_538;
        puVar17 = (ulong *)(plVar12 + 2);
        if ((ulong *)*plVar12 == puVar17) {
          local_538 = *puVar17;
          lStack_530 = plVar12[3];
        }
        else {
          local_538 = *puVar17;
          local_548 = (ulong *)*plVar12;
        }
        local_540 = plVar12[1];
        *plVar12 = (long)puVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
      }
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) {
        uVar21 = local_608.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_540 + local_608._M_string_length) {
        uVar22 = 0xf;
        if (local_548 != &local_538) {
          uVar22 = local_538;
        }
        if (uVar22 < local_540 + local_608._M_string_length) goto LAB_0015bb10;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_548,0,(char *)0x0,(ulong)local_608._M_dataplus._M_p);
      }
      else {
LAB_0015bb10:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_608,(ulong)local_548)
        ;
      }
      local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
      puVar17 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_628.field_2._M_allocated_capacity = *puVar17;
        local_628.field_2._8_8_ = puVar13[3];
      }
      else {
        local_628.field_2._M_allocated_capacity = *puVar17;
        local_628._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_628._M_string_length = puVar13[1];
      *puVar13 = puVar17;
      puVar13[1] = 0;
      *(undefined1 *)puVar17 = 0;
      if (pptVar20 == local_4d0) {
        local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"");
      }
      else {
        xception_list_abi_cxx11_(&local_190,this,ptVar10);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x3a9b9f);
        local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
        puVar17 = (ulong *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_4b8.field_2._M_allocated_capacity = *puVar17;
          local_4b8.field_2._8_8_ = plVar12[3];
        }
        else {
          local_4b8.field_2._M_allocated_capacity = *puVar17;
          local_4b8._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_4b8._M_string_length = plVar12[1];
        *plVar12 = (long)puVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
      }
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        uVar21 = local_628.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_4b8._M_string_length + local_628._M_string_length) {
        uVar21 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          uVar21 = local_4b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar21 < local_4b8._M_string_length + local_628._M_string_length)
        goto LAB_0015bc89;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_4b8,0,(char *)0x0,(ulong)local_628._M_dataplus._M_p);
      }
      else {
LAB_0015bc89:
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_628,(ulong)local_4b8._M_dataplus._M_p);
      }
      local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
      psVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_5e8.field_2._M_allocated_capacity = *psVar18;
        local_5e8.field_2._8_8_ = puVar13[3];
      }
      else {
        local_5e8.field_2._M_allocated_capacity = *psVar18;
        local_5e8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_5e8._M_string_length = puVar13[1];
      *puVar13 = psVar18;
      puVar13[1] = 0;
      *(undefined1 *)psVar18 = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_5e8);
      local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
      psVar18 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_5c8.field_2._M_allocated_capacity = *psVar18;
        local_5c8.field_2._8_8_ = plVar12[3];
      }
      else {
        local_5c8.field_2._M_allocated_capacity = *psVar18;
        local_5c8._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_5c8._M_string_length = plVar12[1];
      *plVar12 = (long)psVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
        operator_delete(local_5e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p);
      }
      if ((pptVar20 != local_4d0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2)) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if (local_548 != &local_538) {
        operator_delete(local_548);
      }
      if ((local_4c8 != local_4c0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2)) {
        operator_delete(local_170._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) {
        operator_delete(local_608._M_dataplus._M_p);
      }
      if (local_588 != &local_578) {
        operator_delete(local_588);
      }
      if (local_634 == '\0') {
        if (local_2f0 != &local_2e0) {
          operator_delete(local_2f0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
      }
      if (local_5a8 != &local_598) {
        operator_delete(local_5a8);
      }
      if (local_498 != &local_488) {
        operator_delete(local_498);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      poVar14 = t_generator::indent((t_generator *)this,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"gboolean (*",0xb);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(char *)local_478.super_t_doc._vptr_t_doc,
                           (long)local_478.super_t_doc.doc_._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,") ",2);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,local_5c8._M_dataplus._M_p,local_5c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
        operator_delete(local_5c8._M_dataplus._M_p);
      }
      if (local_478.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_478.super_t_doc.doc_._M_string_length) {
        operator_delete(local_478.super_t_doc._vptr_t_doc);
      }
      pptVar19 = pptVar19 + 1;
    } while (pptVar19 !=
             local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"};",2);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"typedef struct _",0x10);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Class ",6);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Class;",6);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"GType ",6);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(char *)local_568,local_560);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_get_type (void);",0x11);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"#define ",8);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"TYPE_",5);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_HANDLER ",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(",1);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_568,local_560);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_get_type())",0xc);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"#define ",8);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(obj) ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,"(G_TYPE_CHECK_INSTANCE_CAST ((obj), ",0x24);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"TYPE_",5);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_HANDLER, ",10);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"))",2);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"#define ",8);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"IS_",3);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_HANDLER(obj) ",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,"(G_TYPE_CHECK_INSTANCE_TYPE ((obj), ",0x24);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"TYPE_",5);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_HANDLER))",10);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"#define ",8);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,"_CLASS(c) (G_TYPE_CHECK_CLASS_CAST ((c), ",0x29);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"TYPE_",5);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_HANDLER, ",10);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Class))",7);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"#define ",8);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"IS_",3);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_HANDLER_CLASS(c) ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"(G_TYPE_CHECK_CLASS_TYPE ((c), ",0x1f)
  ;
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"TYPE_",5);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_HANDLER))",10);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"#define ",8);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length
                      );
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_HANDLER_GET_CLASS(obj) ",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,"(G_TYPE_INSTANCE_GET_CLASS ((obj), ",0x23);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"TYPE_",5);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_HANDLER, ",10);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Class))",7);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar19 = local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar5 = ((*pptVar19)->name_)._M_dataplus._M_p;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar5,pcVar5 + ((*pptVar19)->name_)._M_string_length);
      initial_caps_to_underscores((string *)&local_478,&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      ptVar7 = *pptVar19;
      ptVar8 = ptVar7->returntype_;
      ptVar9 = ptVar7->arglist_;
      ptVar10 = ptVar7->xceptions_;
      iVar11 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])(ptVar8);
      local_4c0 = (ptVar9->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      local_4c8 = (ptVar9->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      local_4d0 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar20 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      std::operator+(&local_2d0,"(",local_398);
      puVar13 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_2d0,
                           (ulong)(this->super_t_oop_generator).super_t_generator.service_name_.
                                  _M_dataplus._M_p);
      local_498 = &local_488;
      plVar12 = puVar13 + 2;
      if ((long *)*puVar13 == plVar12) {
        local_488 = *plVar12;
        lStack_480 = puVar13[3];
      }
      else {
        local_488 = *plVar12;
        local_498 = (long *)*puVar13;
      }
      local_490 = puVar13[1];
      *puVar13 = plVar12;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_498);
      local_5a8 = &local_598;
      puVar17 = puVar13 + 2;
      if ((ulong *)*puVar13 == puVar17) {
        local_598 = *puVar17;
        uStack_590 = *(undefined4 *)(puVar13 + 3);
        uStack_58c = *(undefined4 *)((long)puVar13 + 0x1c);
      }
      else {
        local_598 = *puVar17;
        local_5a8 = (ulong *)*puVar13;
      }
      local_5a0 = puVar13[1];
      *puVar13 = puVar17;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      local_634 = (char)iVar11;
      if (local_634 == '\0') {
        type_name_abi_cxx11_(&local_4b8,this,ptVar8,false,false);
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_4b8,0,(char *)0x0,0x3a9b9f);
        local_548 = &local_538;
        puVar17 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar17) {
          local_538 = *puVar17;
          lStack_530 = puVar13[3];
        }
        else {
          local_538 = *puVar17;
          local_548 = (ulong *)*puVar13;
        }
        local_540 = puVar13[1];
        *puVar13 = puVar17;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_548);
        local_588 = &local_578;
        puVar17 = puVar13 + 2;
        if ((ulong *)*puVar13 == puVar17) {
          local_578 = *puVar17;
          lStack_570 = puVar13[3];
        }
        else {
          local_578 = *puVar17;
          local_588 = (ulong *)*puVar13;
        }
        local_580 = puVar13[1];
        *puVar13 = puVar17;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
      }
      else {
        local_588 = &local_578;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"");
      }
      uVar22 = 0xf;
      if (local_5a8 != &local_598) {
        uVar22 = local_598;
      }
      if (uVar22 < (ulong)(local_580 + local_5a0)) {
        uVar22 = 0xf;
        if (local_588 != &local_578) {
          uVar22 = local_578;
        }
        if (uVar22 < (ulong)(local_580 + local_5a0)) goto LAB_0015ca21;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_588,0,(char *)0x0,(ulong)local_5a8);
      }
      else {
LAB_0015ca21:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5a8,(ulong)local_588)
        ;
      }
      local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
      puVar17 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_608.field_2._M_allocated_capacity = *puVar17;
        local_608.field_2._8_8_ = puVar13[3];
      }
      else {
        local_608.field_2._M_allocated_capacity = *puVar17;
        local_608._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_608._M_string_length = puVar13[1];
      *puVar13 = puVar17;
      puVar13[1] = 0;
      *(undefined1 *)puVar17 = 0;
      if (local_4c8 == local_4c0) {
        local_3b8 = &local_3a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"");
      }
      else {
        argument_list_abi_cxx11_(&local_1b0,this,ptVar9);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x3a9b9f);
        local_3b8 = &local_3a8;
        puVar17 = (ulong *)(plVar12 + 2);
        if ((ulong *)*plVar12 == puVar17) {
          local_3a8 = *puVar17;
          lStack_3a0 = plVar12[3];
        }
        else {
          local_3a8 = *puVar17;
          local_3b8 = (ulong *)*plVar12;
        }
        local_3b0 = plVar12[1];
        *plVar12 = (long)puVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
      }
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) {
        uVar21 = local_608.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_3b0 + local_608._M_string_length) {
        uVar22 = 0xf;
        if (local_3b8 != &local_3a8) {
          uVar22 = local_3a8;
        }
        if (uVar22 < local_3b0 + local_608._M_string_length) goto LAB_0015cba5;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_3b8,0,(char *)0x0,(ulong)local_608._M_dataplus._M_p);
      }
      else {
LAB_0015cba5:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_608,(ulong)local_3b8)
        ;
      }
      local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
      puVar17 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_628.field_2._M_allocated_capacity = *puVar17;
        local_628.field_2._8_8_ = puVar13[3];
      }
      else {
        local_628.field_2._M_allocated_capacity = *puVar17;
        local_628._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_628._M_string_length = puVar13[1];
      *puVar13 = puVar17;
      puVar13[1] = 0;
      *(undefined1 *)puVar17 = 0;
      if (pptVar20 == local_4d0) {
        local_3d8 = &local_3c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"");
      }
      else {
        xception_list_abi_cxx11_(&local_1d0,this,ptVar10);
        plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x3a9b9f);
        local_3d8 = &local_3c8;
        puVar17 = (ulong *)(plVar12 + 2);
        if ((ulong *)*plVar12 == puVar17) {
          local_3c8 = *puVar17;
          lStack_3c0 = plVar12[3];
        }
        else {
          local_3c8 = *puVar17;
          local_3d8 = (ulong *)*plVar12;
        }
        local_3d0 = plVar12[1];
        *plVar12 = (long)puVar17;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
      }
      uVar21 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        uVar21 = local_628.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar21 < local_3d0 + local_628._M_string_length) {
        uVar22 = 0xf;
        if (local_3d8 != &local_3c8) {
          uVar22 = local_3c8;
        }
        if (uVar22 < local_3d0 + local_628._M_string_length) goto LAB_0015cd1e;
        puVar13 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_3d8,0,(char *)0x0,(ulong)local_628._M_dataplus._M_p);
      }
      else {
LAB_0015cd1e:
        puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_628,(ulong)local_3d8)
        ;
      }
      local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
      psVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_5e8.field_2._M_allocated_capacity = *psVar18;
        local_5e8.field_2._8_8_ = puVar13[3];
      }
      else {
        local_5e8.field_2._M_allocated_capacity = *psVar18;
        local_5e8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_5e8._M_string_length = puVar13[1];
      *puVar13 = psVar18;
      puVar13[1] = 0;
      *(undefined1 *)psVar18 = 0;
      puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_5e8);
      local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
      psVar18 = puVar13 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar13 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_5c8.field_2._M_allocated_capacity = *psVar18;
        local_5c8.field_2._8_8_ = puVar13[3];
      }
      else {
        local_5c8.field_2._M_allocated_capacity = *psVar18;
        local_5c8._M_dataplus._M_p = (pointer)*puVar13;
      }
      local_5c8._M_string_length = puVar13[1];
      *puVar13 = psVar18;
      puVar13[1] = 0;
      *(undefined1 *)(puVar13 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
        operator_delete(local_5e8._M_dataplus._M_p);
      }
      if (local_3d8 != &local_3c8) {
        operator_delete(local_3d8);
      }
      if ((pptVar20 != local_4d0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2)) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      if (local_3b8 != &local_3a8) {
        operator_delete(local_3b8);
      }
      if ((local_4c8 != local_4c0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2)) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) {
        operator_delete(local_608._M_dataplus._M_p);
      }
      if (local_588 != &local_578) {
        operator_delete(local_588);
      }
      if (local_634 == '\0') {
        if (local_548 != &local_538) {
          operator_delete(local_548);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
          operator_delete(local_4b8._M_dataplus._M_p);
        }
      }
      if (local_5a8 != &local_598) {
        operator_delete(local_5a8);
      }
      if (local_498 != &local_488) {
        operator_delete(local_498);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"gboolean ",9);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,(char *)local_568,local_560);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_",1);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(char *)local_478.super_t_doc._vptr_t_doc,
                           (long)local_478.super_t_doc.doc_._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,local_5c8._M_dataplus._M_p,local_5c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
        operator_delete(local_5c8._M_dataplus._M_p);
      }
      if (local_478.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_478.super_t_doc.doc_._M_string_length) {
        operator_delete(local_478.super_t_doc._vptr_t_doc);
      }
      pptVar19 = pptVar19 + 1;
    } while (pptVar19 !=
             local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  poVar1 = &this->f_service_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"static void",0xb);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_568,local_560);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_",1);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_370._M_dataplus._M_p,local_370._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_if_interface_init (",0x14);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace)._M_dataplus._M_p,(this->nspace)._M_string_length);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->super_t_oop_generator).super_t_generator.service_name_.
                               _M_dataplus._M_p,
                       (this->super_t_oop_generator).super_t_generator.service_name_.
                       _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"IfInterface *iface);",0x14);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  psVar18 = &local_478.super_t_doc.doc_._M_string_length;
  local_478.super_t_doc._vptr_t_doc = (_func_int **)psVar18;
  std::__cxx11::string::_M_construct((ulong)&local_478,'\x19');
  std::__cxx11::string::operator=((string *)&local_390,(string *)&local_478);
  if (local_478.super_t_doc._vptr_t_doc != (_func_int **)psVar18) {
    operator_delete(local_478.super_t_doc._vptr_t_doc);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"G_DEFINE_TYPE_WITH_CODE (",0x19);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_390,local_388);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_568,local_560);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_390,local_388);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_2b0,(long)local_2a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,local_390,local_388);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"G_IMPLEMENT_INTERFACE (",0x17);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"TYPE_",5);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_IF,",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  psVar18 = &local_478.super_t_doc.doc_._M_string_length;
  local_478.super_t_doc._vptr_t_doc = (_func_int **)psVar18;
  std::__cxx11::string::_M_construct((ulong)&local_478,'\x17');
  std::__cxx11::string::_M_append((char *)&local_390,(ulong)local_478.super_t_doc._vptr_t_doc);
  if (local_478.super_t_doc._vptr_t_doc != (_func_int **)psVar18) {
    operator_delete(local_478.super_t_doc._vptr_t_doc);
  }
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_390,local_388);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_568,local_560);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_",1);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_370._M_dataplus._M_p,local_370._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_if_interface_init))",0x14);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar19 = local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
      pcVar5 = ((*pptVar19)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5c8,pcVar5,pcVar5 + ((*pptVar19)->name_)._M_string_length);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_5c8._M_dataplus._M_p,
                 local_5c8._M_dataplus._M_p + local_5c8._M_string_length);
      initial_caps_to_underscores(&local_5e8,&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      ptVar7 = *pptVar19;
      ptVar8 = ptVar7->returntype_;
      ptVar9 = ptVar7->arglist_;
      ptVar10 = ptVar7->xceptions_;
      local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_628,local_370._M_dataplus._M_p,
                 local_370._M_dataplus._M_p + local_370._M_string_length);
      std::__cxx11::string::append((char *)&local_628);
      plVar12 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_628,(ulong)local_5e8._M_dataplus._M_p);
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      psVar18 = (size_type *)(plVar12 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_310.field_2._M_allocated_capacity = *psVar18;
        local_310.field_2._8_8_ = plVar12[3];
      }
      else {
        local_310.field_2._M_allocated_capacity = *psVar18;
        local_310._M_dataplus._M_p = (pointer)*plVar12;
      }
      local_310._M_string_length = plVar12[1];
      *plVar12 = (long)psVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      t_function::t_function(&local_478,ptVar8,&local_310,ptVar9,ptVar10,(*pptVar19)->oneway_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      poVar14 = t_generator::indent((t_generator *)this,(ostream *)poVar1);
      function_signature_abi_cxx11_(&local_628,this,&local_478);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,local_628._M_dataplus._M_p,local_628._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)poVar1);
      t_generator::indent_abi_cxx11_(&local_628,(t_generator *)this);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,local_628._M_dataplus._M_p,local_628._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"g_return_val_if_fail (",0x16);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(this->nspace_uc)._M_dataplus._M_p,
                           (this->nspace_uc)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"IS_",3);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_HANDLER (iface), FALSE);",0x19);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,
                           ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_608,(t_generator *)this);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,local_608._M_dataplus._M_p,local_608._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"return ",7);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,local_290._M_dataplus._M_p,local_290._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_GET_CLASS (iface)",0x12);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"->",2);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," (iface, ",9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_608._M_dataplus._M_p != &local_608.field_2) {
        operator_delete(local_608._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_628._M_dataplus._M_p != &local_628.field_2) {
        operator_delete(local_628._M_dataplus._M_p);
      }
      iVar11 = (*(ptVar8->super_t_doc)._vptr_t_doc[4])();
      if ((char)iVar11 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"_return, ",9);
      }
      for (pptVar20 = (ptVar9->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pptVar20 !=
          (ptVar9->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar20 = pptVar20 + 1) {
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,((*pptVar20)->name_)._M_dataplus._M_p,
                             ((*pptVar20)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
      }
      for (pptVar20 = (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          pptVar20 !=
          (ptVar10->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar20 = pptVar20 + 1) {
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,((*pptVar20)->name_)._M_dataplus._M_p,
                             ((*pptVar20)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"error);",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                 ::endl_abi_cxx11_._M_string_length);
      t_function::~t_function(&local_478);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
        operator_delete(local_5e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
        operator_delete(local_5c8._M_dataplus._M_p);
      }
      pptVar19 = pptVar19 + 1;
    } while (pptVar19 !=
             local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"static void",0xb);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_568,local_560);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_",1);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_370._M_dataplus._M_p,local_370._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_if_interface_init (",0x14);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->nspace)._M_dataplus._M_p,(this->nspace)._M_string_length);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,(this->super_t_oop_generator).super_t_generator.service_name_.
                               _M_dataplus._M_p,
                       (this->super_t_oop_generator).super_t_generator.service_name_.
                       _M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"IfInterface *iface)",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)poVar1);
  if (local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"THRIFT_UNUSED_VAR (iface);",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
  }
  else if (local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    pptVar19 = local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pcVar5 = ((*pptVar19)->name_)._M_dataplus._M_p;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f0,pcVar5,pcVar5 + ((*pptVar19)->name_)._M_string_length);
      initial_caps_to_underscores((string *)&local_478,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_5c8,(t_generator *)this);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,local_5c8._M_dataplus._M_p,local_5c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"iface->",7);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(char *)local_478.super_t_doc._vptr_t_doc,
                           (long)local_478.super_t_doc.doc_._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," = ",3);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(char *)local_568,local_560);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_",1);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,(char *)local_478.super_t_doc._vptr_t_doc,
                           (long)local_478.super_t_doc.doc_._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
        operator_delete(local_5c8._M_dataplus._M_p);
      }
      if (local_478.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_478.super_t_doc.doc_._M_string_length) {
        operator_delete(local_478.super_t_doc._vptr_t_doc);
      }
      pptVar19 = pptVar19 + 1;
    } while (pptVar19 !=
             local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"static void",0xb);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_568,local_560);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_init (",7);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," *self)",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)poVar1);
  t_generator::indent_abi_cxx11_((string *)&local_478,(t_generator *)this);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(char *)local_478.super_t_doc._vptr_t_doc,
                       (long)local_478.super_t_doc.doc_._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"THRIFT_UNUSED_VAR (self);",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_478.super_t_doc._vptr_t_doc !=
      (_func_int **)&local_478.super_t_doc.doc_._M_string_length) {
    operator_delete(local_478.super_t_doc._vptr_t_doc);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"static void",0xb);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                       ::endl_abi_cxx11_._M_string_length);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)local_568,local_560);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"_class_init (",0xd);
  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_528._M_dataplus._M_p,local_528._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Class *cls)",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)poVar1);
  if (local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    t_generator::indent_abi_cxx11_((string *)&local_478,(t_generator *)this);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)poVar1,(char *)local_478.super_t_doc._vptr_t_doc,
                         (long)local_478.super_t_doc.doc_._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"THRIFT_UNUSED_VAR (cls);",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if (local_478.super_t_doc._vptr_t_doc !=
        (_func_int **)&local_478.super_t_doc.doc_._M_string_length) {
      operator_delete(local_478.super_t_doc._vptr_t_doc);
    }
  }
  else if (local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    pptVar19 = local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      local_478.super_t_doc._vptr_t_doc = (_func_int **)&local_478.super_t_doc.doc_._M_string_length
      ;
      pcVar5 = ((*pptVar19)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_478,pcVar5,pcVar5 + ((*pptVar19)->name_)._M_string_length);
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,local_478.super_t_doc._vptr_t_doc,
                 local_478.super_t_doc.doc_._M_dataplus._M_p +
                 (long)local_478.super_t_doc._vptr_t_doc);
      initial_caps_to_underscores(&local_5c8,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_5e8,(t_generator *)this);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,local_5e8._M_dataplus._M_p,local_5e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"cls->",5);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,local_5c8._M_dataplus._M_p,local_5c8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," = NULL;",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
        operator_delete(local_5e8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
        operator_delete(local_5c8._M_dataplus._M_p);
      }
      if (local_478.super_t_doc._vptr_t_doc !=
          (_func_int **)&local_478.super_t_doc.doc_._M_string_length) {
        operator_delete(local_478.super_t_doc._vptr_t_doc);
      }
      pptVar19 = pptVar19 + 1;
    } while (pptVar19 !=
             local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  if (local_390 != local_380) {
    operator_delete(local_390);
  }
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_350 != local_340) {
    operator_delete(local_350);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p);
  }
  if (local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_508.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_c_glib_generator::generate_service_handler(t_service* tservice) {
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::const_iterator function_iter;

  string service_name_lc = to_lower_case(initial_caps_to_underscores(service_name_));
  string service_name_uc = to_upper_case(service_name_lc);

  string service_handler_name = service_name_ + "Handler";

  string class_name = this->nspace + service_handler_name;
  string class_name_lc = this->nspace_lc + initial_caps_to_underscores(service_handler_name);
  string class_name_uc = to_upper_case(class_name_lc);

  string parent_class_name;
  string parent_type_name;

  string args_indent;

  // The service this service extends, or nullptr if it extends no service
  t_service* extends_service = tservice->get_extends();

  // Determine the name of our parent service (if any) and the handler class'
  // parent class name and type
  if (extends_service) {
    string parent_service_name = extends_service->get_name();
    string parent_service_name_lc = to_lower_case(initial_caps_to_underscores(parent_service_name));
    string parent_service_name_uc = to_upper_case(parent_service_name_lc);

    parent_class_name = this->nspace + parent_service_name + "Handler";
    parent_type_name = this->nspace_uc + "TYPE_" + parent_service_name_uc + "_HANDLER";
  } else {
    parent_class_name = "GObject";
    parent_type_name = "G_TYPE_OBJECT";
  }

  // Generate the handler class' definition in the header file

  // Generate the handler instance definition
  f_header_ << "/* " << service_name_ << " handler (abstract base class) */" << endl << "struct _"
            << class_name << endl << "{" << endl;
  indent_up();
  f_header_ << indent() << parent_class_name << " parent;" << endl;
  indent_down();
  f_header_ << "};" << endl << "typedef struct _" << class_name << " " << class_name << ";" << endl
            << endl;

  // Generate the handler class definition, including its class members
  // (methods)
  f_header_ << "struct _" << class_name << "Class" << endl << "{" << endl;
  indent_up();
  f_header_ << indent() << parent_class_name << "Class parent;" << endl << endl;

  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string method_name = initial_caps_to_underscores((*function_iter)->get_name());
    t_type* return_type = (*function_iter)->get_returntype();
    t_struct* arg_list = (*function_iter)->get_arglist();
    t_struct* x_list = (*function_iter)->get_xceptions();
    bool has_return = !return_type->is_void();
    bool has_args = arg_list->get_members().size() == 0;
    bool has_xceptions = x_list->get_members().size() == 0;

    string params = "(" + this->nspace + service_name_ + "If *iface"
                    + (has_return ? ", " + type_name(return_type) + "* _return" : "")
                    + (has_args ? "" : (", " + argument_list(arg_list)))
                    + (has_xceptions ? "" : (", " + xception_list(x_list))) + ", GError **error)";

    indent(f_header_) << "gboolean (*" << method_name << ") " << params << ";" << endl;
  }
  indent_down();

  f_header_ << "};" << endl << "typedef struct _" << class_name << "Class " << class_name
            << "Class;" << endl << endl;

  // Generate the remaining header boilerplate
  f_header_ << "GType " << class_name_lc << "_get_type (void);" << endl << "#define "
            << this->nspace_uc << "TYPE_" << service_name_uc << "_HANDLER "
            << "(" << class_name_lc << "_get_type())" << endl << "#define " << class_name_uc
            << "(obj) "
            << "(G_TYPE_CHECK_INSTANCE_CAST ((obj), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER, " << class_name << "))" << endl << "#define "
            << this->nspace_uc << "IS_" << service_name_uc << "_HANDLER(obj) "
            << "(G_TYPE_CHECK_INSTANCE_TYPE ((obj), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER))" << endl << "#define " << class_name_uc
            << "_CLASS(c) (G_TYPE_CHECK_CLASS_CAST ((c), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER, " << class_name << "Class))" << endl << "#define "
            << this->nspace_uc << "IS_" << service_name_uc << "_HANDLER_CLASS(c) "
            << "(G_TYPE_CHECK_CLASS_TYPE ((c), " << this->nspace_uc << "TYPE_" << service_name_uc
            << "_HANDLER))" << endl << "#define " << this->nspace_uc << service_name_uc
            << "_HANDLER_GET_CLASS(obj) "
            << "(G_TYPE_INSTANCE_GET_CLASS ((obj), " << this->nspace_uc << "TYPE_"
            << service_name_uc << "_HANDLER, " << class_name << "Class))" << endl << endl;

  // Generate the handler class' method definitions
  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string method_name = initial_caps_to_underscores((*function_iter)->get_name());
    t_type* return_type = (*function_iter)->get_returntype();
    t_struct* arg_list = (*function_iter)->get_arglist();
    t_struct* x_list = (*function_iter)->get_xceptions();
    bool has_return = !return_type->is_void();
    bool has_args = arg_list->get_members().size() == 0;
    bool has_xceptions = x_list->get_members().size() == 0;

    string params = "(" + this->nspace + service_name_ + "If *iface"
                    + (has_return ? ", " + type_name(return_type) + "* _return" : "")
                    + (has_args ? "" : (", " + argument_list(arg_list)))
                    + (has_xceptions ? "" : (", " + xception_list(x_list))) + ", GError **error)";

    f_header_ << "gboolean " << class_name_lc << "_" << method_name << " " << params << ";" << endl;
  }
  f_header_ << endl;

  // Generate the handler's implementation in the implementation file

  // Generate the implementation boilerplate
  f_service_ << "static void" << endl << class_name_lc << "_" << service_name_lc
             << "_if_interface_init (" << this->nspace << service_name_ << "IfInterface *iface);"
             << endl << endl;

  args_indent = string(25, ' ');
  f_service_ << "G_DEFINE_TYPE_WITH_CODE (" << class_name << ", " << endl << args_indent
             << class_name_lc << "," << endl << args_indent << parent_type_name << "," << endl
             << args_indent << "G_IMPLEMENT_INTERFACE (" << this->nspace_uc << "TYPE_"
             << service_name_uc << "_IF," << endl;
  args_indent += string(23, ' ');
  f_service_ << args_indent << class_name_lc << "_" << service_name_lc << "_if_interface_init))"
             << endl << endl;

  // Generate the handler method implementations
  for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
    string function_name = (*function_iter)->get_name();
    string method_name = initial_caps_to_underscores(function_name);
    t_type* return_type = (*function_iter)->get_returntype();
    t_struct* arg_list = (*function_iter)->get_arglist();
    t_struct* x_list = (*function_iter)->get_xceptions();

    const vector<t_field*>& args = arg_list->get_members();
    const vector<t_field*>& xceptions = x_list->get_members();

    vector<t_field*>::const_iterator field_iter;

    t_function implementing_function(return_type,
                                     service_name_lc + "_handler_" + method_name,
                                     arg_list,
                                     x_list,
                                     (*function_iter)->is_oneway());

    indent(f_service_) << function_signature(&implementing_function) << endl;
    scope_up(f_service_);
    f_service_ << indent() << "g_return_val_if_fail (" << this->nspace_uc << "IS_"
               << service_name_uc << "_HANDLER (iface), FALSE);" << endl << endl << indent()
               << "return " << class_name_uc << "_GET_CLASS (iface)"
               << "->" << method_name << " (iface, ";

    if (!return_type->is_void()) {
      f_service_ << "_return, ";
    }
    for (field_iter = args.begin(); field_iter != args.end(); ++field_iter) {
      f_service_ << (*field_iter)->get_name() << ", ";
    }
    for (field_iter = xceptions.begin(); field_iter != xceptions.end(); ++field_iter) {
      f_service_ << (*field_iter)->get_name() << ", ";
    }
    f_service_ << "error);" << endl;
    scope_down(f_service_);
    f_service_ << endl;
  }

  // Generate the handler interface initializer
  f_service_ << "static void" << endl << class_name_lc << "_" << service_name_lc
             << "_if_interface_init (" << this->nspace << service_name_ << "IfInterface *iface)"
             << endl;
  scope_up(f_service_);
  if (functions.size() > 0) {
    for (function_iter = functions.begin(); function_iter != functions.end(); ++function_iter) {
      string method_name = initial_caps_to_underscores((*function_iter)->get_name());

      f_service_ << indent() << "iface->" << method_name << " = " << class_name_lc << "_"
                 << method_name << ";" << endl;
    }
  }
  else {
    f_service_ << "THRIFT_UNUSED_VAR (iface);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;

  // Generate the handler instance initializer
  f_service_ << "static void" << endl << class_name_lc << "_init (" << class_name << " *self)"
             << endl;
  scope_up(f_service_);
  f_service_ << indent() << "THRIFT_UNUSED_VAR (self);" << endl;
  scope_down(f_service_);
  f_service_ << endl;

  // Generate the handler class initializer
  f_service_ << "static void" << endl
             << class_name_lc << "_class_init (" << class_name << "Class *cls)"
             << endl;
  scope_up(f_service_);
  if (functions.size() > 0) {
    for (function_iter = functions.begin();
         function_iter != functions.end();
         ++function_iter) {
      string function_name = (*function_iter)->get_name();
      string method_name = initial_caps_to_underscores(function_name);

      // All methods are pure virtual and must be implemented by subclasses
      f_service_ << indent() << "cls->" << method_name << " = NULL;" << endl;
    }
  }
  else {
    f_service_ << indent() << "THRIFT_UNUSED_VAR (cls);" << endl;
  }
  scope_down(f_service_);
  f_service_ << endl;
}